

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O0

Header * __thiscall Imf_3_3::InputFile::Data::getHeader(Data *this,int part)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  ostream *poVar4;
  ArgExc *this_00;
  stringstream *text;
  int in_ESI;
  long in_RDI;
  stringstream _iex_throw_s;
  int i;
  int cursz;
  lock_guard<std::mutex> lk;
  int pc;
  int in_stack_00000cb4;
  Context *in_stack_00000cb8;
  Header *in_stack_fffffffffffffdc8;
  Header *in_stack_fffffffffffffdd0;
  Header *in_stack_fffffffffffffde0;
  size_type in_stack_fffffffffffffde8;
  vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_> *in_stack_fffffffffffffdf0;
  stringstream local_1f0 [16];
  ostream local_1e0 [336];
  Context *in_stack_ffffffffffffff70;
  Context *in_stack_ffffffffffffff90;
  int local_30;
  
  iVar1 = Context::partCount(in_stack_ffffffffffffff90);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffdd0,
             (mutex_type *)in_stack_fffffffffffffdc8);
  if ((-1 < in_ESI) && (in_ESI < iVar1)) {
    sVar2 = std::vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_>::size
                      ((vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_> *)(in_RDI + 0x68))
    ;
    local_30 = (int)sVar2;
    if (local_30 <= in_ESI) {
      std::vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_>::resize
                (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      for (; local_30 <= in_ESI; local_30 = local_30 + 1) {
        Context::header(in_stack_00000cb8,in_stack_00000cb4);
        std::vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_>::operator[]
                  ((vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_> *)(in_RDI + 0x68),
                   (long)local_30);
        Header::operator=(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
        Header::~Header(in_stack_fffffffffffffde0);
      }
    }
    pvVar3 = std::vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_>::operator[]
                       ((vector<Imf_3_3::Header,_std::allocator<Imf_3_3::Header>_> *)(in_RDI + 0x68)
                        ,(long)in_ESI);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1bfa7d);
    return pvVar3;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_1f0);
  poVar4 = std::operator<<(local_1e0,"Invalid out of bounds part number ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_ESI);
  poVar4 = std::operator<<(poVar4,", only ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
  poVar4 = std::operator<<(poVar4," parts in ");
  this_00 = (ArgExc *)Context::fileName(in_stack_ffffffffffffff70);
  std::operator<<(poVar4,(char *)this_00);
  text = (stringstream *)__cxa_allocate_exception(0x48);
  Iex_3_3::ArgExc::ArgExc(this_00,text);
  __cxa_throw(text,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
}

Assistant:

const Header& getHeader (int part)
    {
        int pc = _ctxt->partCount ();
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lk (_mx);
#endif
        if (part >= 0 && part < pc)
        {
            int cursz = static_cast<int> (_lazy_header_cache.size ());
            // lazily build up the cache of headers
            if (part >= cursz)
            {
                _lazy_header_cache.resize (static_cast<size_t> (part) + 1);
                for (int i = cursz; i <= part; ++i)
                    _lazy_header_cache[i] = _ctxt->header (i);
            }
            return _lazy_header_cache[part];
        }
        else
        {
            THROW (
                Iex::ArgExc,
                "Invalid out of bounds part number " << part << ", only " << pc
                                                     << " parts in "
                                                     << _ctxt->fileName ());
        }
    }